

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

uint8 * __thiscall
sentencepiece::NormalizerSpec::_InternalSerialize
          (NormalizerSpec *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  int size;
  string *psVar4;
  uint8 *puVar5;
  InternalMetadata *pIVar6;
  void *data;
  uint32 cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8 *target_local;
  NormalizerSpec *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    psVar4 = _internal_name_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,psVar4,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar4 = _internal_precompiled_charsmap_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             (stream,2,psVar4,(uint8 *)stream_local);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    bVar2 = _internal_add_dummy_prefix(this);
    uVar3 = google::protobuf::internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar2,puVar5)
    ;
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    bVar2 = _internal_remove_extra_whitespaces(this);
    uVar3 = google::protobuf::internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar2,puVar5)
    ;
  }
  if ((uVar1 & 0x20) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)stream_local);
    bVar2 = _internal_escape_whitespaces(this);
    uVar3 = google::protobuf::internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::CodedOutputStream::WriteVarint32ToArray((uint)bVar2,puVar5)
    ;
  }
  if ((uVar1 & 4) != 0) {
    psVar4 = _internal_normalization_rule_tsv_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,6,psVar4,(uint8 *)stream_local);
  }
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerialize
                           (&this->_extensions_,200,0x20000000,(uint8 *)stream_local,stream);
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    pIVar6 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar6->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar6);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    data = (void *)std::__cxx11::string::data();
    pIVar6 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)pIVar6->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (pIVar6);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8 *)stream_local);
  }
  return (uint8 *)stream_local;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NormalizerSpec::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NormalizerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional bytes precompiled_charsmap = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        2, this->_internal_precompiled_charsmap(), target);
  }

  // optional bool add_dummy_prefix = 3 [default = true];
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_add_dummy_prefix(), target);
  }

  // optional bool remove_extra_whitespaces = 4 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(4, this->_internal_remove_extra_whitespaces(), target);
  }

  // optional bool escape_whitespaces = 5 [default = true];
  if (cached_has_bits & 0x00000020u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_escape_whitespaces(), target);
  }

  // optional string normalization_rule_tsv = 6;
  if (cached_has_bits & 0x00000004u) {
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_normalization_rule_tsv(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NormalizerSpec)
  return target;
}